

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONMemory.h
# Opt level: O0

char * json_malloc<char>(size_t count)

{
  bool condition;
  allocator local_39;
  json_string local_38;
  char *local_18;
  void *result;
  size_t count_local;
  
  result = (void *)count;
  local_18 = (char *)malloc(count);
  condition = local_18 != (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"Out of memory",&local_39);
  JSONDebug::_JSON_ASSERT(condition,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return local_18;
}

Assistant:

static inline T * json_malloc(size_t count) json_nothrow {
	   #ifdef JSON_DEBUG  //in debug mode, see if the malloc was successful
		  void * result = std::malloc(count * sizeof(T));
		  JSON_ASSERT(result != 0, JSON_TEXT("Out of memory"));
		  #ifdef JSON_NULL_MEMORY
			 std::memset(result, '\0', count  * sizeof(T));
		  #endif
		  return (T *)result;
	   #else
		  return (T *)std::malloc(count * sizeof(T));
	   #endif
    }